

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_function.hpp
# Opt level: O3

vector sisl::basis_function::grad_convolution_sum_h<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                 (vector *p,cartesian_cubic<float> *base,cartesian_cubic<float> **lattices,double *h
                 )

{
  long *plVar1;
  double *pdVar2;
  char cVar3;
  float *pfVar4;
  char *__function;
  Index extraout_RDX;
  long lVar5;
  DenseStorage<int,__1,__1,_1,_0> *other;
  vector vVar6;
  lattice_site c;
  lattice_site s;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  sites;
  lattice_site extent;
  undefined1 local_e0 [16];
  void *local_d0 [2];
  DenseStorage<int,__1,__1,_1,_0> local_c0;
  double local_b0;
  cartesian_cubic<float> *local_a8;
  DenseStorage<int,__1,__1,_1,_0> *local_a0;
  cartesian_cubic<float> **local_98;
  cartesian_cubic<float> *local_90;
  DenseStorage<int,__1,__1,_1,_0> *local_88;
  undefined1 *local_80;
  DenseStorage<int,__1,__1,_1,_0> *local_78;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  local_58;
  void *local_40 [2];
  
  tp_linear::get_integer_support<3>();
  local_a8 = base;
  (**(code **)&(*lattices)[1]._nx)(local_e0,lattices,base);
  (*(code *)((*lattices)->_array).first)(local_40,lattices);
  (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
       (double *)0x0;
  (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize((DenseStorage<double,__1,__1,_1,_0> *)p,3,3,1);
  lVar5 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar5 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  local_98 = lattices;
  if (lVar5 != 0) {
    memset((p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar5 << 3);
  }
  local_a0 = (DenseStorage<int,__1,__1,_1,_0> *)
             local_58.
             super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_58.
      super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    other = (DenseStorage<int,__1,__1,_1,_0> *)
            local_58.
            super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      Eigen::DenseStorage<int,_-1,_-1,_1,_0>::DenseStorage(&local_c0,other);
      local_90 = (cartesian_cubic<float> *)local_e0;
      local_88 = &local_c0;
      if (local_e0._8_8_ != local_c0.m_rows) {
LAB_00111a72:
        __function = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int>, const Eigen::Matrix<int, -1, 1>, const Eigen::Matrix<int, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<int>, Lhs = const Eigen::Matrix<int, -1, 1>, Rhs = const Eigen::Matrix<int, -1, 1>]"
        ;
LAB_00111a87:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
      }
      Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_d0,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                  *)&local_90);
      cVar3 = (*(code *)(*local_98)[1]._sy)
                        (local_98,(PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_d0);
      free(local_d0[0]);
      if (cVar3 != '\0') {
        if (local_e0._8_8_ != local_c0.m_rows) goto LAB_00111a72;
        local_90 = local_a8;
        local_80 = local_e0;
        local_78 = &local_c0;
        if (*(double *)&local_a8->_nx != (double)local_e0._8_8_) {
          __function = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int, double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int>, const Eigen::Matrix<int, -1, 1>, const Eigen::Matrix<int, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int, double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int>, const Eigen::Matrix<int, -1, 1>, const Eigen::Matrix<int, -1, 1>>>]"
          ;
          goto LAB_00111a87;
        }
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_d0,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>_>
                    *)&local_90);
        local_b0 = tp_linear::phi<3>((vector *)local_d0);
        free(local_d0[0]);
        if ((local_b0 != 0.0) || (NAN(local_b0))) {
          lVar5 = 0;
          do {
            plVar1 = (long *)h[lVar5];
            if (plVar1 != (long *)0x0) {
              local_90 = (cartesian_cubic<float> *)local_e0;
              local_88 = &local_c0;
              if (local_e0._8_8_ != local_c0.m_rows) goto LAB_00111a72;
              Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
              PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                        ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_d0,
                         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                          *)&local_90);
              cVar3 = (**(code **)(*plVar1 + 0xa0))
                                (plVar1,(PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_d0)
              ;
              free(local_d0[0]);
              if (cVar3 != '\0') {
                plVar1 = (long *)h[lVar5];
                local_90 = (cartesian_cubic<float> *)local_e0;
                local_88 = &local_c0;
                if (local_e0._8_8_ != local_c0.m_rows) goto LAB_00111a72;
                Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
                PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                          ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_d0,
                           (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                            *)&local_90);
                pfVar4 = (float *)(**(code **)(*plVar1 + 0x28))
                                            (plVar1,(PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>>
                                                     *)local_d0);
                if ((p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_rows <= lVar5) {
                  __assert_fail("index >= 0 && index < size()",
                                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                               );
                }
                pdVar2 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data;
                pdVar2[lVar5] = (double)*pfVar4 * local_b0 + pdVar2[lVar5];
                free(local_d0[0]);
              }
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != 3);
        }
      }
      free(local_c0.m_data);
      other = other + 1;
    } while (other != local_a0);
  }
  free(local_40[0]);
  free((void *)local_e0._0_8_);
  std::
  vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_58);
  vVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  vVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)p;
  return (vector)vVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

static vector grad_convolution_sum_h(const vector &p, const L* base, const L **lattices, const double &h) {
            auto sites = BF::template get_integer_support<N>();
            lattice_site c = base->get_nearest_site(p);
            lattice_site extent = base->get_dimensions();

            vector value(N);
            value.setZero();

            for(lattice_site s : sites) {
                if(!base->is_lattice_site(c+s)) continue;

                double w = BF::template phi<N>(h, p - (c+s).cast<double>());

                if(w == 0.) continue;

                for(int j = 0; j < N; j++) {
                    if(lattices[j] == nullptr) continue;
                    if(!lattices[j]->is_filled(c+s)) continue;
                    value[j] += w * (double)(*lattices[j])(c + s);
                }
            }
            return value;
        }